

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRMultipartImageFromFile
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,char *filename,char **err
              )

{
  reference __ptr;
  char *in_RCX;
  int in_EDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  char **in_stack_00000150;
  size_t in_stack_00000158;
  uchar *in_stack_00000160;
  uint in_stack_0000016c;
  EXRHeader **in_stack_00000170;
  EXRImage *in_stack_00000178;
  char **in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  char *in_stack_fffffffffffffeb8;
  allocator_type *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffed0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  size_t local_c0;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [32];
  FILE *local_70;
  allocator local_51;
  string local_50 [40];
  char *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  int local_4;
  
  if (((in_RDI == 0) || (in_RSI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0)) ||
     (in_EDX == 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"Invalid argument for LoadEXRMultipartImageFromFile",&local_51);
    tinyexr::SetErrorMessage
              ((string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_4 = -3;
  }
  else {
    local_70 = (FILE *)0x0;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_70 = fopen(in_RCX,"rb");
    if (local_70 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,local_28,&local_b1);
      std::operator+(in_stack_fffffffffffffeb8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      tinyexr::SetErrorMessage
                ((string *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 in_stack_fffffffffffffea8);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      local_4 = -7;
    }
    else {
      fseek(local_70,0,2);
      local_c0 = ftell(local_70);
      fseek(local_70,0,0);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x50de46);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (in_stack_fffffffffffffed0,
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x50de69);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_d8,0);
      fread(__ptr,1,local_c0,local_70);
      fclose(local_70);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (size_type)in_stack_fffffffffffffea8);
      local_4 = LoadEXRMultipartImageFromMemory
                          (in_stack_00000178,in_stack_00000170,in_stack_0000016c,in_stack_00000160,
                           in_stack_00000158,in_stack_00000150);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_18);
    }
  }
  return local_4;
}

Assistant:

int LoadEXRMultipartImageFromFile(EXRImage *exr_images,
                                  const EXRHeader **exr_headers,
                                  unsigned int num_parts, const char *filename,
                                  const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0) {
    tinyexr::SetErrorMessage(
        "Invalid argument for LoadEXRMultipartImageFromFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
      _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"rb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "rb");
#endif
#else
  fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize);  //  @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRMultipartImageFromMemory(exr_images, exr_headers, num_parts,
                                         &buf.at(0), filesize, err);
}